

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInExtension
          (Generator *this,FieldDescriptor *extension_field)

{
  Descriptor *pDVar1;
  LogMessage *other;
  mapped_type *pmVar2;
  allocator<char> local_b2;
  allocator<char> local_b1;
  key_type local_b0;
  string local_90;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  key_type local_38;
  
  if (extension_field[0x34] == (FieldDescriptor)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&m,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/python/python_generator.cc"
               ,0x332);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&m,"CHECK failed: extension_field.is_extension(): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_90,other);
    internal::LogMessage::~LogMessage((LogMessage *)&m);
  }
  pDVar1 = *(Descriptor **)(extension_field + 0x40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&m,"extensions_by_name",(allocator<char> *)&local_90);
  FixForeignFieldsInField(this,pDVar1,extension_field,(string *)&m);
  std::__cxx11::string::~string((string *)&m);
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &m._M_t._M_impl.super__Rb_tree_header._M_header;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  m._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  m._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       m._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  ModuleLevelMessageName_abi_cxx11_(&local_90,this,*(Descriptor **)(extension_field + 0x38));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"extended_message_class",(allocator<char> *)&local_38);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  pDVar1 = *(Descriptor **)(extension_field + 0x40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"extensions_by_name",&local_b1);
  FieldReferencingExpression(&local_90,this,pDVar1,extension_field,&local_b0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"field",&local_b2);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&m,&local_38);
  std::__cxx11::string::operator=((string *)pmVar2,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  io::Printer::Print(this->printer_,&m,"$extended_message_class$.RegisterExtension($field$)\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&m._M_t);
  return;
}

Assistant:

void Generator::FixForeignFieldsInExtension(
    const FieldDescriptor& extension_field) const {
  GOOGLE_CHECK(extension_field.is_extension());
  // extension_scope() will be NULL for top-level extensions, which is
  // exactly what FixForeignFieldsInField() wants.
  FixForeignFieldsInField(extension_field.extension_scope(), extension_field,
                          "extensions_by_name");

  map<string, string> m;
  // Confusingly, for FieldDescriptors that happen to be extensions,
  // containing_type() means "extended type."
  // On the other hand, extension_scope() will give us what we normally
  // mean by containing_type().
  m["extended_message_class"] = ModuleLevelMessageName(
      *extension_field.containing_type());
  m["field"] = FieldReferencingExpression(extension_field.extension_scope(),
                                          extension_field,
                                          "extensions_by_name");
  printer_->Print(m, "$extended_message_class$.RegisterExtension($field$)\n");
}